

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_catalog_entry.cpp
# Opt level: O2

string * __thiscall
duckdb::IndexCatalogEntry::ToSQL_abi_cxx11_(string *__return_storage_ptr__,IndexCatalogEntry *this)

{
  CreateInfo *in_RAX;
  pointer pCVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  (*(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[8])
            (&local_18);
  pCVar1 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)&local_18);
  (*(pCVar1->super_ParseInfo)._vptr_ParseInfo[5])(__return_storage_ptr__,pCVar1);
  if (local_18._M_head_impl != (CreateInfo *)0x0) {
    (*((local_18._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

string IndexCatalogEntry::ToSQL() const {
	auto info = GetInfo();
	return info->ToString();
}